

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  int iVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  bool bVar4;
  sbyte sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  stbi_uc sVar17;
  stbi_uc *psVar18;
  uint uVar19;
  char *zout;
  int iVar20;
  int iVar21;
  long lVar22;
  undefined1 auVar23 [16];
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  ushort auStack_2026e [32623];
  byte abStack_1038f [63879];
  undefined1 local_a08 [15];
  undefined4 uStack_9f9;
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0015f6e8:
    a->num_bits = 0;
    a->code_buffer = 0;
    do {
      iVar10 = 0x1c93c0;
      if (a->num_bits < 1) {
        stbi__fill_bits(a);
      }
      iVar20 = a->num_bits;
      uVar8 = a->code_buffer;
      a->code_buffer = uVar8 >> 1;
      a->num_bits = iVar20 + -1;
      if (iVar20 < 3) {
        stbi__fill_bits(a);
      }
      iVar20 = a->num_bits;
      uVar13 = a->code_buffer;
      a->code_buffer = uVar13 >> 2;
      a->num_bits = iVar20 - 2U;
      iVar9 = 0;
      switch(uVar13 & 3) {
      case 0:
        uVar13 = iVar20 - 2U & 7;
        if (uVar13 != 0) {
          if (iVar20 < 2) {
            stbi__fill_bits(a);
          }
          a->code_buffer = a->code_buffer >> (sbyte)uVar13;
          a->num_bits = a->num_bits - uVar13;
        }
        iVar10 = a->num_bits;
        if (iVar10 < 1) {
          uVar11 = 0;
        }
        else {
          uVar13 = a->code_buffer;
          uVar11 = 0;
          iVar20 = iVar10;
          do {
            *(char *)((long)local_814.fast + uVar11) = (char)uVar13;
            uVar11 = uVar11 + 1;
            uVar13 = uVar13 >> 8;
            iVar10 = iVar20 + -8;
            bVar4 = 8 < iVar20;
            iVar20 = iVar10;
          } while (bVar4);
          a->code_buffer = uVar13;
          a->num_bits = iVar10;
        }
        if (iVar10 != 0) {
          __assert_fail("a->num_bits == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image.h"
                        ,0x1035,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
        }
        if ((uint)uVar11 < 4) {
          psVar18 = a->zbuffer;
          psVar3 = a->zbuffer_end;
          uVar11 = uVar11 & 0xffffffff;
          do {
            if (psVar18 < psVar3) {
              a->zbuffer = psVar18 + 1;
              sVar17 = *psVar18;
              psVar18 = psVar18 + 1;
            }
            else {
              sVar17 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar11) = sVar17;
            uVar11 = uVar11 + 1;
          } while (uVar11 != 4);
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) {
          uVar11 = (ulong)local_814.fast[0];
          if (a->zbuffer_end < a->zbuffer + uVar11) {
            stbi__g_failure_reason = "read past buffer";
          }
          else if ((a->zout + uVar11 <= a->zout_end) ||
                  (iVar10 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar10 != 0)) {
            memcpy(a->zout,a->zbuffer,uVar11);
            a->zbuffer = a->zbuffer + uVar11;
            a->zout = a->zout + uVar11;
            goto LAB_0015fee6;
          }
        }
        else {
          stbi__g_failure_reason = "zlib corrupt";
        }
        goto LAB_0015ff2a;
      case 1:
        iVar20 = stbi__zbuild_huffman
                           (&a->z_length,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar20 == 0) {
          return 0;
        }
        psVar18 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        iVar20 = 0x20;
        break;
      case 2:
        if (iVar20 < 7) {
          stbi__fill_bits(a);
        }
        iVar10 = a->num_bits;
        uVar13 = a->code_buffer;
        a->code_buffer = uVar13 >> 5;
        a->num_bits = iVar10 + -5;
        if (iVar10 < 10) {
          stbi__fill_bits(a);
        }
        iVar10 = a->num_bits;
        uVar19 = a->code_buffer;
        a->code_buffer = uVar19 >> 5;
        a->num_bits = iVar10 + -5;
        if (iVar10 < 9) {
          stbi__fill_bits(a);
        }
        uVar13 = uVar13 & 0x1f;
        iVar10 = uVar13 + 0x101;
        iVar20 = (uVar19 & 0x1f) + 1;
        uVar19 = a->code_buffer;
        a->code_buffer = uVar19 >> 4;
        a->num_bits = a->num_bits + -4;
        local_a08 = SUB1615((undefined1  [16])0x0,0);
        uStack_9f9 = 0;
        lVar22 = 0;
        do {
          if (a->num_bits < 3) {
            stbi__fill_bits(a);
          }
          uVar15 = a->code_buffer;
          a->code_buffer = uVar15 >> 3;
          a->num_bits = a->num_bits + -3;
          local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[lVar22]] =
               (byte)uVar15 & 7;
          lVar22 = lVar22 + 1;
        } while ((ulong)(uVar19 & 0xf) + 4 != lVar22);
        iVar9 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
        if (iVar9 == 0) goto LAB_0015ff2a;
        iVar21 = iVar20 + iVar10;
        iVar9 = 0;
        while( true ) {
          if (iVar21 <= iVar9) break;
          if (a->num_bits < 0x10) {
            stbi__fill_bits(a);
          }
          uVar19 = a->code_buffer;
          uVar12 = local_814.fast[uVar19 & 0x1ff];
          if (uVar12 == 0) {
            auVar23._8_8_ = 0x8040201008040201;
            auVar23._0_8_ = 0x8040201008040201;
            auVar23 = vgf2p8affineqb_avx512vl(ZEXT416(uVar19),auVar23,0);
            uVar12 = auVar23._0_2_ << 8 | auVar23._0_2_ >> 8;
            lVar22 = 0;
            do {
              lVar14 = lVar22;
              lVar22 = lVar14 + 1;
            } while (local_814.maxcode[lVar14 + 10] <= (int)(uint)uVar12);
            uVar15 = 0xffffffff;
            if (lVar22 != 7) {
              lVar16 = (ulong)local_814.firstsymbol[lVar14 + 10] +
                       ((ulong)(uVar12 >> ((byte)(7 - (char)lVar22) & 0x1f)) -
                       (ulong)local_814.firstcode[lVar14 + 10]);
              if ((ulong)*(byte *)((long)&local_814 + lVar16 + 0x484) - 9 != lVar22)
              goto LAB_0015ff42;
              a->code_buffer = uVar19 >> ((int)lVar14 + 10U & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar22) + -9;
              uVar15 = (uint)*(ushort *)((long)&local_814 + lVar16 * 2 + 0x5a4);
            }
          }
          else {
            a->code_buffer = uVar19 >> (uVar12 >> 9 & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar12 >> 9);
            uVar15 = uVar12 & 0x1ff;
          }
          if (uVar15 < 0x13) {
            if ((int)uVar15 < 0x10) {
              lVar22 = (long)iVar9;
              iVar9 = iVar9 + 1;
              abStack_9e9[lVar22 + 1] = (char)uVar15;
            }
            else {
              iVar1 = a->num_bits;
              if (uVar15 == 0x11) {
                if (iVar1 < 3) {
                  stbi__fill_bits(a);
                }
                uVar19 = a->code_buffer;
                a->code_buffer = uVar19 >> 3;
                a->num_bits = a->num_bits + -3;
                uVar19 = (uVar19 & 7) + 3;
LAB_0015fa7d:
                uVar15 = 0;
              }
              else {
                if (uVar15 != 0x10) {
                  if (iVar1 < 7) {
                    stbi__fill_bits(a);
                  }
                  uVar19 = a->code_buffer;
                  a->code_buffer = uVar19 >> 7;
                  a->num_bits = a->num_bits + -7;
                  uVar19 = (uVar19 & 0x7f) + 0xb;
                  goto LAB_0015fa7d;
                }
                if (iVar1 < 2) {
                  stbi__fill_bits(a);
                }
                uVar19 = a->code_buffer;
                a->code_buffer = uVar19 >> 2;
                a->num_bits = a->num_bits + -2;
                if (iVar9 == 0) {
                  iVar9 = 0;
                  goto LAB_0015f9ce;
                }
                uVar19 = (uVar19 & 3) + 3;
                uVar15 = (uint)abStack_9e9[iVar9];
              }
              if (iVar21 - iVar9 < (int)uVar19) goto LAB_0015f9ce;
              memset(abStack_9e9 + (long)iVar9 + 1,uVar15,(ulong)uVar19);
              iVar9 = iVar9 + uVar19;
            }
            bVar4 = true;
          }
          else {
LAB_0015f9ce:
            stbi__g_failure_reason = "bad codelengths";
            bVar4 = false;
          }
          if (!bVar4) goto LAB_0015ff2a;
        }
        if (iVar21 != iVar9) {
          stbi__g_failure_reason = "bad codelengths";
          goto LAB_0015ff2a;
        }
        iVar10 = stbi__zbuild_huffman(&a->z_length,(stbi_uc *)((long)abStack_9e9 + 1),iVar10);
        if (iVar10 == 0) goto LAB_0015ff2a;
        psVar18 = asStack_8e7 + uVar13;
        iVar10 = 0;
        break;
      case 3:
        goto switchD_0015f766_caseD_3;
      }
      iVar20 = stbi__zbuild_huffman(&a->z_distance,psVar18,iVar20);
      if (iVar20 == 0) goto LAB_0015ff2a;
      zout = a->zout;
      do {
        if (a->num_bits < 0x10) {
          stbi__fill_bits(a);
        }
        uVar13 = a->code_buffer;
        uVar12 = (a->z_length).fast[uVar13 & 0x1ff];
        if (uVar12 == 0) {
          auVar7._8_8_ = 0x8040201008040201;
          auVar7._0_8_ = 0x8040201008040201;
          auVar23 = vgf2p8affineqb_avx512vl(ZEXT416(uVar13),auVar7,0);
          uVar12 = auVar23._0_2_ << 8 | auVar23._0_2_ >> 8;
          lVar22 = 0;
          do {
            lVar14 = lVar22;
            lVar22 = lVar14 + 1;
          } while ((a->z_length).maxcode[lVar14 + 10] <= (int)(uint)uVar12);
          uVar19 = 0xffffffff;
          if (lVar22 != 7) {
            lVar16 = (ulong)(a->z_length).firstsymbol[lVar14 + 10] +
                     ((ulong)(uVar12 >> ((byte)(7 - (char)lVar22) & 0x1f)) -
                     (ulong)(a->z_length).firstcode[lVar14 + 10]);
            if ((ulong)*(byte *)((long)a + lVar16 + 0x4b8) - 9 != lVar22) {
LAB_0015ff42:
              __assert_fail("z->size[b] == s",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image.h"
                            ,0xf98,
                            "int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
            }
            a->code_buffer = uVar13 >> ((int)lVar14 + 10U & 0x1f);
            a->num_bits = (a->num_bits - (int)lVar22) + -9;
            uVar19 = (uint)*(ushort *)((long)a + lVar16 * 2 + 0x5d8);
          }
        }
        else {
          a->code_buffer = uVar13 >> (uVar12 >> 9 & 0x1f);
          a->num_bits = a->num_bits - (uint)(uVar12 >> 9);
          uVar19 = uVar12 & 0x1ff;
        }
        if ((int)uVar19 < 0x100) {
          if ((int)uVar19 < 0) {
LAB_0015fda1:
            stbi__g_failure_reason = "bad huffman code";
            goto LAB_0015fdaf;
          }
          if (a->zout_end <= zout) {
            iVar20 = stbi__zexpand(a,zout,1);
            if (iVar20 == 0) goto LAB_0015fdaf;
            zout = a->zout;
          }
          *zout = (char)uVar19;
          zout = zout + 1;
          bVar4 = true;
        }
        else if (uVar19 == 0x100) {
          a->zout = zout;
          iVar10 = 1;
          bVar4 = false;
        }
        else {
          uVar11 = (ulong)(uVar19 - 0x101);
          uVar13 = stbi__zlength_base[uVar11];
          if (0xffffffffffffffeb < uVar11 - 0x1c) {
            uVar19 = stbi__zlength_extra[uVar11];
            if (a->num_bits < (int)uVar19) {
              stbi__fill_bits(a);
            }
            uVar15 = a->code_buffer;
            sVar5 = ((byte)uVar19 < 0x21) * (' ' - (byte)uVar19);
            a->code_buffer = uVar15 >> (uVar19 & 0x1f);
            a->num_bits = a->num_bits - uVar19;
            uVar13 = uVar13 + ((uVar15 << sVar5) >> sVar5);
          }
          if (a->num_bits < 0x10) {
            stbi__fill_bits(a);
          }
          uVar19 = a->code_buffer;
          uVar12 = (a->z_distance).fast[uVar19 & 0x1ff];
          if (uVar12 == 0) {
            auVar6._8_8_ = 0x8040201008040201;
            auVar6._0_8_ = 0x8040201008040201;
            auVar23 = vgf2p8affineqb_avx512vl(ZEXT416(uVar19),auVar6,0);
            uVar12 = auVar23._0_2_ << 8 | auVar23._0_2_ >> 8;
            lVar22 = 0;
            do {
              lVar14 = lVar22;
              lVar22 = lVar14 + 1;
            } while ((a->z_distance).maxcode[lVar14 + 10] <= (int)(uint)uVar12);
            uVar15 = 0xffffffff;
            if (lVar22 != 7) {
              lVar16 = (ulong)(a->z_distance).firstsymbol[lVar14 + 10] +
                       ((ulong)(uVar12 >> ((byte)(7 - (char)lVar22) & 0x1f)) -
                       (ulong)(a->z_distance).firstcode[lVar14 + 10]);
              if ((ulong)*(byte *)((long)a + lVar16 + 0xc9c) - 9 != lVar22) goto LAB_0015ff42;
              a->code_buffer = uVar19 >> ((int)lVar14 + 10U & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar22) + -9;
              uVar15 = (uint)*(ushort *)((long)a + lVar16 * 2 + 0xdbc);
            }
          }
          else {
            a->code_buffer = uVar19 >> (uVar12 >> 9 & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar12 >> 9);
            uVar15 = uVar12 & 0x1ff;
          }
          if ((int)uVar15 < 0) goto LAB_0015fda1;
          uVar11 = (ulong)uVar15;
          iVar20 = stbi__zdist_base[uVar11];
          if (0xffffffffffffffe5 < uVar11 - 0x1e) {
            uVar19 = stbi__zdist_extra[uVar11];
            if (a->num_bits < (int)uVar19) {
              stbi__fill_bits(a);
            }
            uVar15 = a->code_buffer;
            sVar5 = ((byte)uVar19 < 0x21) * (' ' - (byte)uVar19);
            a->code_buffer = uVar15 >> (uVar19 & 0x1f);
            a->num_bits = a->num_bits - uVar19;
            iVar20 = iVar20 + ((uVar15 << sVar5) >> sVar5);
          }
          if ((long)zout - (long)a->zout_start < (long)iVar20) {
            stbi__g_failure_reason = "bad dist";
LAB_0015fdaf:
            bVar4 = false;
            iVar10 = 0;
          }
          else {
            if (a->zout_end < zout + (int)uVar13) {
              iVar9 = stbi__zexpand(a,zout,uVar13);
              if (iVar9 == 0) goto LAB_0015fdaf;
              zout = a->zout;
            }
            lVar22 = -(long)iVar20;
            bVar4 = true;
            if (iVar20 == 1) {
              if (uVar13 != 0) {
                memset(zout,(uint)(byte)zout[lVar22],(ulong)uVar13);
                zout = zout + (ulong)(uVar13 - 1) + 1;
              }
            }
            else {
              for (; uVar13 != 0; uVar13 = uVar13 - 1) {
                *zout = zout[lVar22];
                zout = zout + 1;
              }
            }
          }
        }
      } while (bVar4);
      if (iVar10 == 0) {
        return 0;
      }
LAB_0015fee6:
    } while ((uVar8 & 1) == 0);
    iVar9 = 1;
  }
  else {
    pbVar2 = a->zbuffer;
    uVar13 = 0;
    uVar8 = 0;
    if (pbVar2 < a->zbuffer_end) {
      a->zbuffer = pbVar2 + 1;
      uVar8 = (uint)*pbVar2;
    }
    pbVar2 = a->zbuffer;
    if (pbVar2 < a->zbuffer_end) {
      a->zbuffer = pbVar2 + 1;
      uVar13 = (uint)*pbVar2;
    }
    if ((uVar8 << 8 | uVar13) * -0x42108421 < 0x8421085) {
      if ((uVar13 & 0x20) == 0) {
        if ((uVar8 & 0xf) == 8) goto LAB_0015f6e8;
        stbi__g_failure_reason = "bad compression";
      }
      else {
        stbi__g_failure_reason = "no preset dict";
      }
    }
    else {
      stbi__g_failure_reason = "bad zlib header";
    }
LAB_0015ff2a:
    iVar9 = 0;
  }
switchD_0015f766_caseD_3:
  return iVar9;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}